

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npc.cpp
# Opt level: O0

void __thiscall NPC::Spawn(NPC *this,NPC *parent)

{
  byte bVar1;
  byte bVar2;
  short sVar3;
  NPC *this_00;
  Character *this_01;
  bool bVar4;
  int iVar5;
  ENF_Data *pEVar6;
  vector<NPC_*,_std::allocator<NPC_*>_> *this_02;
  reference ppNVar7;
  undefined8 uVar8;
  list<Character_*,_std::allocator<Character_*>_> *this_03;
  reference ppCVar9;
  double dVar10;
  Character *character;
  iterator __end1;
  iterator __begin1;
  list<Character_*,_std::allocator<Character_*>_> *__range1;
  undefined1 local_70 [8];
  PacketBuilder builder;
  int i;
  bool found;
  NPC *npc;
  iterator __end2;
  iterator __begin2;
  vector<NPC_*,_std::allocator<NPC_*>_> *__range2;
  NPC *parent_local;
  NPC *this_local;
  
  if ((this->alive & 1U) == 0) {
    pEVar6 = ENF(this);
    if ((pEVar6->boss != 0) && (parent == (NPC *)0x0)) {
      this_02 = &this->map->npcs;
      __end2 = std::vector<NPC_*,_std::allocator<NPC_*>_>::begin(this_02);
      npc = (NPC *)std::vector<NPC_*,_std::allocator<NPC_*>_>::end(this_02);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>
                                         *)&npc), bVar4) {
        ppNVar7 = __gnu_cxx::__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>
                  ::operator*(&__end2);
        this_00 = *ppNVar7;
        pEVar6 = ENF(this_00);
        if (pEVar6->child != 0) {
          Spawn(this_00,this);
        }
        __gnu_cxx::__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::
        operator++(&__end2);
      }
    }
    if (parent != (NPC *)0x0) {
      this->parent = parent;
    }
    if (this->spawn_type < 7) {
      builder.add_size._7_1_ = 0;
      for (builder.add_size._0_4_ = 0; (int)builder.add_size < 200;
          builder.add_size._0_4_ = (int)builder.add_size + 1) {
        if (((this->temporary & 1U) == 0) || ((int)builder.add_size != 0)) {
          iVar5 = util::rand();
          this->x = (uchar)iVar5;
          iVar5 = util::rand();
          this->y = (uchar)iVar5;
        }
        else {
          this->x = this->spawn_x;
          this->y = this->spawn_y;
        }
        bVar4 = Map::Walkable(this->map,this->x,this->y,true);
        if ((bVar4) &&
           ((100 < (int)builder.add_size ||
            (bVar4 = Map::Occupied(this->map,this->x,this->y,NPCOnly,false), !bVar4)))) {
          iVar5 = util::rand();
          this->direction = (Direction)iVar5;
          builder.add_size._7_1_ = 1;
          break;
        }
      }
      if ((builder.add_size._7_1_ & 1) == 0) {
        sVar3 = this->map->id;
        bVar1 = this->spawn_x;
        bVar2 = this->spawn_y;
        ::ENF::Get(this->map->world->enf,this->id);
        uVar8 = std::__cxx11::string::c_str();
        Console::Wrn("An NPC on map %i at %i,%i is being placed by linear scan of spawn area (%s)",
                     (ulong)(uint)(int)sVar3,(ulong)bVar1,(ulong)bVar2,uVar8);
        this->x = this->spawn_x + 0xfe;
        while ((uint)this->x <= this->spawn_x + 2) {
          this->y = this->spawn_y + 0xfe;
          while ((uint)this->y <= this->spawn_y + 2) {
            bVar4 = Map::Walkable(this->map,this->x,this->y,true);
            if (bVar4) {
              Console::Wrn("Placed at valid location: %i,%i",(ulong)this->x,(ulong)this->y);
              builder.add_size._7_1_ = 1;
              goto LAB_001ef334;
            }
            this->y = this->y + '\x01';
          }
          this->x = this->x + '\x01';
        }
      }
LAB_001ef334:
      if ((builder.add_size._7_1_ & 1) == 0) {
        Console::Err("NPC couldn\'t spawn anywhere valid!");
      }
    }
    this->alive = true;
    pEVar6 = ENF(this);
    this->hp = pEVar6->hp;
    dVar10 = Timer::GetTime();
    this->last_act = dVar10;
    this->act_speed = speed_table[this->spawn_type];
    PacketBuilder::PacketBuilder((PacketBuilder *)local_70,PACKET_RANGE,PACKET_REPLY,8);
    PacketBuilder::AddChar((PacketBuilder *)local_70,0);
    PacketBuilder::AddByte((PacketBuilder *)local_70,0xff);
    PacketBuilder::AddChar((PacketBuilder *)local_70,(uint)this->index);
    PacketBuilder::AddShort((PacketBuilder *)local_70,this->id);
    PacketBuilder::AddChar((PacketBuilder *)local_70,(uint)this->x);
    PacketBuilder::AddChar((PacketBuilder *)local_70,(uint)this->y);
    PacketBuilder::AddChar((PacketBuilder *)local_70,(uint)this->direction);
    this_03 = &this->map->characters;
    __end1 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin(this_03);
    character = (Character *)
                std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end(this_03);
    while (bVar4 = std::operator!=(&__end1,(_Self *)&character), bVar4) {
      ppCVar9 = std::_List_iterator<Character_*>::operator*(&__end1);
      this_01 = *ppCVar9;
      bVar4 = Character::InRange(this_01,this);
      if (bVar4) {
        Character::Send(this_01,(PacketBuilder *)local_70);
      }
      std::_List_iterator<Character_*>::operator++(&__end1);
    }
    PacketBuilder::~PacketBuilder((PacketBuilder *)local_70);
  }
  return;
}

Assistant:

void NPC::Spawn(NPC *parent)
{
	if (this->alive)
		return;

	if (this->ENF().boss && !parent)
	{
		UTIL_FOREACH(this->map->npcs, npc)
		{
			if (npc->ENF().child)
			{
				npc->Spawn(this);
			}
		}
	}

	if (parent)
	{
		this->parent = parent;
	}

	if (this->spawn_type < 7)
	{
		bool found = false;
		for (int i = 0; i < 200; ++i)
		{
			if (this->temporary && i == 0)
			{
				this->x = this->spawn_x;
				this->y = this->spawn_y;
			}
			else
			{
				this->x = util::rand(this->spawn_x-2, this->spawn_x+2);
				this->y = util::rand(this->spawn_y-2, this->spawn_y+2);
			}

			if (this->map->Walkable(this->x, this->y, true) && (i > 100 || !this->map->Occupied(this->x, this->y, Map::NPCOnly)))
			{
				this->direction = static_cast<Direction>(util::rand(0,3));
				found = true;
				break;
			}
		}

		if (!found)
		{
			Console::Wrn("An NPC on map %i at %i,%i is being placed by linear scan of spawn area (%s)", this->map->id, this->spawn_x, this->spawn_y, this->map->world->enf->Get(this->id).name.c_str());
			for (this->x = this->spawn_x-2; this->x <= spawn_x+2; ++this->x)
			{
				for (this->y = this->spawn_y-2; this->y <= this->spawn_y+2; ++this->y)
				{
					if (this->map->Walkable(this->x, this->y, true))
					{
						Console::Wrn("Placed at valid location: %i,%i", this->x, this->y);
						found = true;
						goto end_linear_scan;
					}
				}
			}
		}
		end_linear_scan:

		if (!found)
		{
			Console::Err("NPC couldn't spawn anywhere valid!");
		}
	}

	this->alive = true;
	this->hp = this->ENF().hp;
	this->last_act = Timer::GetTime();
	this->act_speed = speed_table[this->spawn_type];

	PacketBuilder builder(PACKET_RANGE, PACKET_REPLY, 8);
	builder.AddChar(0);
	builder.AddByte(255);
	builder.AddChar(this->index);
	builder.AddShort(this->id);
	builder.AddChar(this->x);
	builder.AddChar(this->y);
	builder.AddChar(this->direction);

	UTIL_FOREACH(this->map->characters, character)
	{
		if (character->InRange(this))
		{
			character->Send(builder);
		}
	}
}